

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxShellsort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start)

{
  long lVar1;
  IdxElement *pIVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  undefined4 uVar7;
  int iVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  IdxElement *pIVar13;
  long lVar14;
  bool bVar15;
  
  lVar12 = 2;
  do {
    iVar4 = SPxShellsort<soplex::SPxPricer<double>::IdxElement,_soplex::SPxPricer<double>::IdxCompare>
            ::incs[lVar12];
    lVar1 = (long)iVar4 + (long)start;
    lVar14 = lVar1;
    iVar10 = start;
    if ((int)lVar1 <= end) {
      do {
        iVar8 = keys[lVar14].idx;
        uVar9 = *(undefined4 *)&keys[lVar14].field_0x4;
        dVar3 = keys[lVar14].val;
        iVar11 = (int)lVar14;
        iVar5 = iVar10;
        if (lVar1 <= lVar14) {
          do {
            if (dVar3 < keys[iVar5].val || dVar3 == keys[iVar5].val) {
              iVar11 = iVar5 + iVar4;
              goto LAB_0020c9c5;
            }
            pIVar13 = keys + iVar5;
            uVar7 = *(undefined4 *)&pIVar13->field_0x4;
            dVar6 = pIVar13->val;
            pIVar2 = keys + (iVar4 + iVar5);
            pIVar2->idx = pIVar13->idx;
            *(undefined4 *)&pIVar2->field_0x4 = uVar7;
            pIVar2->val = dVar6;
            iVar11 = iVar5 - iVar4;
            bVar15 = (int)lVar1 <= iVar5;
            iVar5 = iVar11;
          } while (bVar15);
          iVar11 = iVar11 + iVar4;
        }
LAB_0020c9c5:
        keys[iVar11].idx = iVar8;
        *(undefined4 *)&keys[iVar11].field_0x4 = uVar9;
        keys[iVar11].val = dVar3;
        lVar14 = lVar14 + 1;
        iVar10 = iVar10 + 1;
      } while (end + 1 != (int)lVar14);
    }
    bVar15 = lVar12 == 0;
    lVar12 = lVar12 + -1;
    if (bVar15) {
      return;
    }
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}